

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_allocator_adaptor.hpp
# Opt level: O2

pointer __thiscall
boost::alignment::
aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
::allocate(aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
           *this,size_type size)

{
  char *pcVar1;
  pointer pvVar2;
  uintptr_t __intptr;
  char_alloc a;
  new_allocator<char> local_1;
  
  pcVar1 = __gnu_cxx::new_allocator<char>::allocate(&local_1,size * 0x40 + 0x47,(void *)0x0);
  pvVar2 = (pointer)((ulong)(pcVar1 + 0x47) & 0xffffffffffffffc0);
  if (0x3f < (ulong)((long)((ulong)(pcVar1 + 0x47) & 0xffffffffffffffc0) - (long)(pcVar1 + 8))) {
    pvVar2 = (pointer)(pcVar1 + 8);
  }
  *(char **)&pvVar2[-1].field_0x38 = pcVar1;
  return pvVar2;
}

Assistant:

pointer allocate(size_type size) {
        enum {
            m = min_align<value_type>::value
        };
        std::size_t s = size * sizeof(value_type);
        std::size_t n = s + m - 1;
        char_alloc a(base());
        char_ptr p = a.allocate(sizeof p + n);
        void* r = boost::to_address(p) + sizeof p;
        (void)boost::alignment::align(m, s, r, n);
        ::new(static_cast<void*>(static_cast<char_ptr*>(r) - 1)) char_ptr(p);
        return static_cast<pointer>(r);
    }